

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

Min_Cube_t * Min_CubeAlloc(Min_Man_t *p)

{
  Min_Cube_t *pMVar1;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  
  pMVar1 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
  pMVar1->pNext = (Min_Cube_t *)0x0;
  *(uint *)&pMVar1->field_0x8 = *(uint *)&pMVar1->field_0x8 & 0xfffffc00 | p->nVars & 0x3ffU;
  *(uint *)&pMVar1->field_0x8 =
       *(uint *)&pMVar1->field_0x8 & 0xffc003ff | (p->nWords & 0xfffU) << 10;
  *(uint *)&pMVar1->field_0x8 = *(uint *)&pMVar1->field_0x8 & 0x3fffff;
  memset(pMVar1->uData,0xff,(long)p->nWords << 2);
  return pMVar1;
}

Assistant:

static inline Min_Cube_t * Min_CubeAlloc( Min_Man_t * p )
{
    Min_Cube_t * pCube;
    pCube = (Min_Cube_t *)Extra_MmFixedEntryFetch( p->pMemMan );
    pCube->pNext  = NULL;
    pCube->nVars  = p->nVars;
    pCube->nWords = p->nWords;
    pCube->nLits  = 0;
    memset( pCube->uData, 0xff, sizeof(unsigned) * p->nWords );
    return pCube;
}